

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cc
# Opt level: O0

uchar * SHA512(uchar *d,size_t n,uchar *md)

{
  undefined1 local_f8 [8];
  SHA512_CTX ctx;
  uint8_t *out_local;
  size_t len_local;
  uint8_t *data_local;
  
  ctx._208_8_ = md;
  BCM_sha512_init((SHA512_CTX *)local_f8);
  BCM_sha512_update((SHA512_CTX *)local_f8,d,n);
  BCM_sha512_final((uint8_t *)ctx._208_8_,(SHA512_CTX *)local_f8);
  OPENSSL_cleanse(local_f8,0xd8);
  return (uchar *)ctx._208_8_;
}

Assistant:

uint8_t *SHA512(const uint8_t *data, size_t len,
                uint8_t out[SHA512_DIGEST_LENGTH]) {
  SHA512_CTX ctx;
  BCM_sha512_init(&ctx);
  BCM_sha512_update(&ctx, data, len);
  BCM_sha512_final(out, &ctx);
  OPENSSL_cleanse(&ctx, sizeof(ctx));
  return out;
}